

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O2

QPixmapCacheEntry * __thiscall
QCache<QPixmapCache::Key,_QPixmapCacheEntry>::relink
          (QCache<QPixmapCache::Key,_QPixmapCacheEntry> *this,Key *key)

{
  Chain *pCVar1;
  Chain *pCVar2;
  Node *pNVar3;
  QPixmapCacheEntry *pQVar4;
  
  if ((this->d).size != 0) {
    pNVar3 = QHashPrivate::Data<QCache<QPixmapCache::Key,_QPixmapCacheEntry>::Node>::
             findNode<QPixmapCache::Key>(&this->d,key);
    if (pNVar3 == (Node *)0x0) {
      pQVar4 = (QPixmapCacheEntry *)0x0;
    }
    else {
      if ((Node *)(this->chain).next != pNVar3) {
        pCVar1 = (pNVar3->super_Chain).prev;
        pCVar2 = (pNVar3->super_Chain).next;
        pCVar1->next = pCVar2;
        pCVar2->prev = pCVar1;
        pCVar1 = (this->chain).next;
        (pNVar3->super_Chain).next = pCVar1;
        pCVar1->prev = &pNVar3->super_Chain;
        (pNVar3->super_Chain).prev = &this->chain;
        (this->chain).next = &pNVar3->super_Chain;
      }
      pQVar4 = (pNVar3->value).t;
    }
    return pQVar4;
  }
  return (QPixmapCacheEntry *)0x0;
}

Assistant:

inline bool isEmpty() const noexcept { return !d.size; }